

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tes3InfoTests.cpp
# Opt level: O3

int __thiscall deqp::gles3::InfoTests::init(InfoTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  TestNode *pTVar2;
  
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"vendor","Vendor String");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0212daa8;
  *(undefined4 *)&pTVar2[1].m_testCtx = 0x1f00;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"renderer","Renderer String");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0212daa8;
  *(undefined4 *)&pTVar2[1].m_testCtx = 0x1f01;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"version","Version String");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0212daa8;
  *(undefined4 *)&pTVar2[1].m_testCtx = 0x1f02;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"shading_language_version",
             "Shading Language Version String");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0212daa8;
  *(undefined4 *)&pTVar2[1].m_testCtx = 0x8b8c;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"extensions","Supported Extensions");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0212db10;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"render_target","Render Target Info")
  ;
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0212db60;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  return extraout_EAX;
}

Assistant:

void InfoTests::init (void)
{
	addChild(new QueryStringCase(m_context, "vendor",					"Vendor String",					GL_VENDOR));
	addChild(new QueryStringCase(m_context, "renderer",					"Renderer String",					GL_RENDERER));
	addChild(new QueryStringCase(m_context, "version",					"Version String",					GL_VERSION));
	addChild(new QueryStringCase(m_context, "shading_language_version",	"Shading Language Version String",	GL_SHADING_LANGUAGE_VERSION));
	addChild(new QueryExtensionsCase(m_context));
	addChild(new RenderTargetInfoCase(m_context));
}